

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testInfo)

{
  char *pcVar1;
  pointer pcVar2;
  
  Option<Catch::TestRunInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestRunInfo.
              super_Option<Catch::TestRunInfo>);
  pcVar1 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           storage;
  *(char **)(this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
            storage =
       (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
       storage + 0x10;
  pcVar2 = (_testInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pcVar1,pcVar2,pcVar2 + (_testInfo->name)._M_string_length);
  (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
  nullableValue = (TestRunInfo *)pcVar1;
  (this->super_StreamingReporterBase).currentTestRunInfo.used = false;
  printTestFilters(this);
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const &_testInfo) {
                StreamingReporterBase::testRunStarting(_testInfo);
                printTestFilters();
            }